

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CheckboxFlagsT<unsigned_int>(char *label,uint *flags,uint flags_value)

{
  uint in_EDX;
  uint *in_RSI;
  bool bVar1;
  ImGuiContext *g;
  bool pressed;
  bool any_on;
  bool all_on;
  bool *in_stack_00000110;
  char *in_stack_00000118;
  bool local_17;
  
  bVar1 = (*in_RSI & in_EDX) == in_EDX;
  if ((bVar1) || ((*in_RSI & in_EDX) == 0)) {
    local_17 = Checkbox(in_stack_00000118,in_stack_00000110);
  }
  else {
    (GImGui->NextItemData).ItemFlags = (GImGui->NextItemData).ItemFlags | 0x1000;
    local_17 = Checkbox(in_stack_00000118,in_stack_00000110);
  }
  if (local_17 != false) {
    if (bVar1) {
      *in_RSI = in_EDX | *in_RSI;
    }
    else {
      *in_RSI = (in_EDX ^ 0xffffffff) & *in_RSI;
    }
  }
  return local_17;
}

Assistant:

bool ImGui::CheckboxFlagsT(const char* label, T* flags, T flags_value)
{
    bool all_on = (*flags & flags_value) == flags_value;
    bool any_on = (*flags & flags_value) != 0;
    bool pressed;
    if (!all_on && any_on)
    {
        ImGuiContext& g = *GImGui;
        g.NextItemData.ItemFlags |= ImGuiItemFlags_MixedValue;
        pressed = Checkbox(label, &all_on);
    }
    else
    {
        pressed = Checkbox(label, &all_on);

    }
    if (pressed)
    {
        if (all_on)
            *flags |= flags_value;
        else
            *flags &= ~flags_value;
    }
    return pressed;
}